

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

int mbedtls_blowfish_crypt_ctr
              (mbedtls_blowfish_context *ctx,size_t length,size_t *nc_off,uchar *nonce_counter,
              uchar *stream_block,uchar *input,uchar *output)

{
  uchar uVar1;
  ulong local_48;
  size_t n;
  int i;
  int c;
  uchar *input_local;
  uchar *stream_block_local;
  uchar *nonce_counter_local;
  size_t *nc_off_local;
  size_t length_local;
  mbedtls_blowfish_context *ctx_local;
  
  local_48 = *nc_off;
  _i = input;
  nc_off_local = (size_t *)length;
  while (nc_off_local != (size_t *)0x0) {
    if (local_48 == 0) {
      mbedtls_blowfish_crypt_ecb(ctx,1,nonce_counter,stream_block);
      n._0_4_ = 8;
      while ((0 < (int)n &&
             (uVar1 = nonce_counter[(int)n + -1], nonce_counter[(int)n + -1] = uVar1 + '\x01',
             (uchar)(uVar1 + '\x01') == '\0'))) {
        n._0_4_ = (int)n + -1;
      }
    }
    *output = *_i ^ stream_block[local_48];
    local_48 = local_48 + 1 & 7;
    output = output + 1;
    _i = _i + 1;
    nc_off_local = (size_t *)((long)nc_off_local + -1);
  }
  *nc_off = local_48;
  return 0;
}

Assistant:

int mbedtls_blowfish_crypt_ctr( mbedtls_blowfish_context *ctx,
                       size_t length,
                       size_t *nc_off,
                       unsigned char nonce_counter[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       unsigned char stream_block[MBEDTLS_BLOWFISH_BLOCKSIZE],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c, i;
    size_t n = *nc_off;

    while( length-- )
    {
        if( n == 0 ) {
            mbedtls_blowfish_crypt_ecb( ctx, MBEDTLS_BLOWFISH_ENCRYPT, nonce_counter,
                                stream_block );

            for( i = MBEDTLS_BLOWFISH_BLOCKSIZE; i > 0; i-- )
                if( ++nonce_counter[i - 1] != 0 )
                    break;
        }
        c = *input++;
        *output++ = (unsigned char)( c ^ stream_block[n] );

        n = ( n + 1 ) % MBEDTLS_BLOWFISH_BLOCKSIZE;
    }

    *nc_off = n;

    return( 0 );
}